

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

void get_gradient(double *values,int start,int last,double *grad)

{
  int local_2c;
  int local_28;
  int next;
  int prev;
  int i;
  double *grad_local;
  int last_local;
  int start_local;
  double *values_local;
  
  i = start;
  if (start == last) {
    grad[start] = 0.0;
  }
  else {
    for (; i <= last; i = i + 1) {
      local_28 = start;
      if (start < i + -1) {
        local_28 = i + -1;
      }
      local_2c = last;
      if (i + 1 < last) {
        local_2c = i + 1;
      }
      grad[i] = (values[local_2c] - values[local_28]) / (double)(local_2c - local_28);
    }
  }
  return;
}

Assistant:

static void get_gradient(const double *values, int start, int last,
                         double *grad) {
  if (start == last) {
    grad[start] = 0;
    return;
  }
  for (int i = start; i <= last; i++) {
    int prev = AOMMAX(i - 1, start);
    int next = AOMMIN(i + 1, last);
    grad[i] = (values[next] - values[prev]) / (next - prev);
  }
}